

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int count_rows(MATRIX *matrix,int n,int i)

{
  size_type sVar1;
  reference this;
  reference pvVar2;
  undefined4 local_20;
  undefined4 local_1c;
  int j;
  int n_rows;
  int i_local;
  int n_local;
  MATRIX *matrix_local;
  
  local_1c = 0;
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(matrix);
    if (sVar1 <= (ulong)(long)local_20) break;
    this = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](matrix,(long)i);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this,(long)local_20);
    if (*pvVar2 == n) {
      local_1c = local_1c + 1;
    }
    local_20 = local_20 + 1;
  }
  return local_1c;
}

Assistant:

int count_rows(MATRIX &matrix, int n, int i){
    int n_rows=0;
    for(int j=0; j<matrix.size(); j++){
        if (matrix[i][j]==n){
            n_rows++;
        }
    }
    return n_rows;
}